

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O2

int has_toplevel_function(char *rtype,char *sig)

{
  Fl_Function_Type *this;
  int iVar1;
  Fl_Class_Type *pFVar2;
  undefined4 extraout_var;
  Fl_Function_Type *fn;
  Fl_Type **ppFVar3;
  
  ppFVar3 = &Fl_Type::first;
  do {
    this = (Fl_Function_Type *)*ppFVar3;
    if (this == (Fl_Function_Type *)0x0) {
      return 0;
    }
    pFVar2 = Fl_Type::is_in_class((Fl_Type *)this);
    if (pFVar2 == (Fl_Class_Type *)0x0) {
      iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[5])(this);
      iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"Function");
      if ((iVar1 == 0) && (iVar1 = Fl_Function_Type::has_signature(this,rtype,sig), iVar1 != 0)) {
        return 1;
      }
    }
    ppFVar3 = &(this->super_Fl_Type).next;
  } while( true );
}

Assistant:

int has_toplevel_function(const char *rtype, const char *sig) {
  Fl_Type *child;
  for (child = Fl_Type::first; child; child = child->next) {
    if (!child->is_in_class() && strcmp(child->type_name(), "Function")==0) {
      const Fl_Function_Type *fn = (const Fl_Function_Type*)child;
      if (fn->has_signature(rtype, sig))
        return 1;
    }
  }
  return 0;
}